

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O1

string * __thiscall
setup::filename_map::convert(string *__return_storage_ptr__,filename_map *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  size_type sVar6;
  string expanded;
  it begin;
  string local_58;
  it local_38;
  
  if ((this->lowercase == true) && (sVar2 = path->_M_string_length, sVar2 != 0)) {
    pcVar3 = (path->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      iVar5 = tolower((int)pcVar3[sVar6]);
      pcVar3[sVar6] = (char)iVar5;
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  if (this->expand == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (path->_M_dataplus)._M_p;
    paVar1 = &path->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar4 = *(undefined8 *)((long)&path->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = path->_M_string_length;
    (path->_M_dataplus)._M_p = (pointer)paVar1;
    path->_M_string_length = 0;
    (path->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_38._M_current = (path->_M_dataplus)._M_p;
    expand_variables(&local_58,this,&local_38,(it)(local_38._M_current + path->_M_string_length),
                     false);
    shorten_path(__return_storage_ptr__,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename_map::convert(std::string path) const {
	
	// Convert paths to lower-case if requested
	if(lowercase) {
		std::transform(path.begin(), path.end(), path.begin(), ::tolower);
	}
	
	// Don't expand variables if requested
	if(!expand) {
		return path;
	}
	
	it begin = path.begin();
	std::string expanded = expand_variables(begin, path.end());
	
	return shorten_path(expanded);
}